

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_movea_16_ix(void)

{
  uint uVar1;
  
  uVar1 = OPER_AY_IX_16();
  m68ki_cpu.dar[(ulong)(m68ki_cpu.ir >> 9 & 7) + 8] = (int)(short)uVar1;
  return;
}

Assistant:

static void m68k_op_movea_16_ix(void)
{
	AX = MAKE_INT_16(OPER_AY_IX_16());
}